

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall kj::_::ForkHub<kj::_::Void>::addBranch(ForkHub<kj::_::Void> *this)

{
  PromiseNode *extraout_RDX;
  ForkHub<kj::_::Void> *in_RSI;
  Promise<void> PVar1;
  Own<kj::_::ForkHub<kj::_::Void>_> local_48;
  Own<kj::_::ForkBranch<kj::_::Void>_> local_38;
  Own<kj::_::PromiseNode> local_28;
  ForkHub<kj::_::Void> *this_local;
  
  this_local = this;
  addRef<kj::_::ForkHub<kj::_::Void>>((kj *)&local_48,in_RSI);
  heap<kj::_::ForkBranch<kj::_::Void>,kj::Own<kj::_::ForkHub<kj::_::Void>>>
            ((kj *)&local_38,&local_48);
  Own<kj::_::PromiseNode>::Own<kj::_::ForkBranch<kj::_::Void>,void>(&local_28,&local_38);
  Promise<void>::Promise((Promise<void> *)this,false,&local_28);
  Own<kj::_::PromiseNode>::~Own(&local_28);
  Own<kj::_::ForkBranch<kj::_::Void>_>::~Own(&local_38);
  Own<kj::_::ForkHub<kj::_::Void>_>::~Own(&local_48);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<_::UnfixVoid<T>> addBranch() {
    return Promise<_::UnfixVoid<T>>(false, kj::heap<ForkBranch<T>>(addRef(*this)));
  }